

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DOMRangeImpl::DOMRangeImpl(DOMRangeImpl *this,DOMRangeImpl *other)

{
  (this->super_DOMRange)._vptr_DOMRange = (_func_int **)&PTR__DOMRangeImpl_00412078;
  this->fStartContainer = other->fStartContainer;
  this->fStartOffset = other->fStartOffset;
  this->fEndContainer = other->fEndContainer;
  this->fEndOffset = other->fEndOffset;
  this->fCollapsed = other->fCollapsed;
  this->fDocument = other->fDocument;
  this->fDetached = other->fDetached;
  this->fRemoveChild = other->fRemoveChild;
  this->fMemoryManager = other->fMemoryManager;
  return;
}

Assistant:

DOMRangeImpl::DOMRangeImpl(const DOMRangeImpl& other)
:   DOMRange(other),
    fStartContainer(other.fStartContainer),
    fStartOffset(other.fStartOffset),
    fEndContainer(other.fEndContainer),
    fEndOffset(other.fEndOffset),
    fCollapsed(other.fCollapsed),
    fDocument(other.fDocument),
    fDetached(other.fDetached),
    fRemoveChild(other.fRemoveChild),
    fMemoryManager(other.fMemoryManager)
{
}